

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

void uprv_getCharNameCharacters_63(USetAdder *sa)

{
  USetAdder *sa_local;
  
  charSetToUSet((uint32_t *)icu_63::gNameSet,sa);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uprv_getCharNameCharacters(const USetAdder *sa) {
    charSetToUSet(gNameSet, sa);
}